

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O0

string * __thiscall
EOPlus::token_got_string_abi_cxx11_(string *__return_storage_ptr__,EOPlus *this,Token *t)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  char *__s;
  uchar h;
  allocator<char> local_21b;
  allocator<char> local_21a;
  allocator<char> local_219;
  string local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  string local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  allocator<char> local_191;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  string local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  allocator<char> local_19;
  EOPlus *local_18;
  Token *t_local;
  
  iVar1 = *(int *)this;
  local_18 = this;
  t_local = (Token *)__return_storage_ptr__;
  if (iVar1 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"invalid token",&local_19);
    std::allocator<char>::~allocator(&local_19);
  }
  else if (iVar1 == 1) {
    util::variant::operator_cast_to_string(&local_70,(variant *)(this + 8));
    std::operator+(&local_50,"identifier \'",&local_70);
    std::operator+(__return_storage_ptr__,&local_50,"\'");
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
  }
  else if (iVar1 == 2) {
    util::variant::operator_cast_to_string(&local_d0,(variant *)(this + 8));
    cut_string(&local_b0,&local_d0);
    std::operator+(&local_90,"string \'",&local_b0);
    std::operator+(__return_storage_ptr__,&local_90,"\'");
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
  }
  else if (iVar1 == 4) {
    util::variant::operator_cast_to_string(&local_110,(variant *)(this + 8));
    std::operator+(&local_f0,"integer \'",&local_110);
    std::operator+(__return_storage_ptr__,&local_f0,"\'");
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_110);
  }
  else if (iVar1 == 8) {
    util::variant::operator_cast_to_string(&local_150,(variant *)(this + 8));
    std::operator+(&local_130,"float \'",&local_150);
    std::operator+(__return_storage_ptr__,&local_130,"\'");
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_150);
  }
  else if (iVar1 == 0x10) {
    bVar2 = util::variant::operator_cast_to_bool((variant *)(this + 8));
    __s = "false";
    if (bVar2) {
      __s = "true";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_190,__s,&local_191);
    std::operator+(&local_170,"boolean \'",&local_190);
    std::operator+(__return_storage_ptr__,&local_170,"\'");
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_190);
    std::allocator<char>::~allocator(&local_191);
  }
  else if (iVar1 == 0x20) {
    uVar3 = util::variant::operator_cast_to_int((variant *)(this + 8));
    op_to_string_abi_cxx11_(&local_1d8,(EOPlus *)(ulong)(uVar3 & 0xff),h);
    std::operator+(&local_1b8,"operator \'",&local_1d8);
    std::operator+(__return_storage_ptr__,&local_1b8,"\'");
    std::__cxx11::string::~string((string *)&local_1b8);
    std::__cxx11::string::~string((string *)&local_1d8);
  }
  else if (iVar1 == 0x40) {
    util::variant::operator_cast_to_string(&local_218,(variant *)(this + 8));
    std::operator+(&local_1f8,"symbol \'",&local_218);
    std::operator+(__return_storage_ptr__,&local_1f8,"\'");
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_218);
  }
  else if (iVar1 == 0x80) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"new-line",&local_219);
    std::allocator<char>::~allocator(&local_219);
  }
  else if (iVar1 == 0x100) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"end of file",&local_21a);
    std::allocator<char>::~allocator(&local_21a);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"unknown token",&local_21b);
    std::allocator<char>::~allocator(&local_21b);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string token_got_string(Token t)
	{
		switch (t.type)
		{
			case Token::Invalid:    return "invalid token";
			case Token::Identifier: return "identifier '" + std::string(t.data) + "'";
			case Token::String:     return "string '" + cut_string(t.data) + "'";
			case Token::Integer:    return "integer '" + std::string(t.data) + "'";
			case Token::Float:      return "float '" + std::string(t.data) + "'";
			case Token::Boolean:    return "boolean '" + std::string(bool(t.data) ? "true" : "false") + "'";
			case Token::Operator:   return "operator '" + op_to_string(int(t.data)) + "'";
			case Token::Symbol:     return "symbol '" + std::string(t.data) + "'";
			case Token::NewLine:    return "new-line";
			case Token::EndOfFile:  return "end of file";
		}

		return "unknown token";
	}